

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int covered(double *child_cub,double *points_x,double *points_y,double *points_z,double disk_raduis,
           int hit)

{
  double dVar1;
  int local_58;
  int local_54;
  int i;
  int m;
  double max_distance;
  double distance;
  int hit_local;
  double disk_raduis_local;
  double *points_z_local;
  double *points_y_local;
  double *points_x_local;
  double *child_cub_local;
  
  local_54 = 0;
  while( true ) {
    if (hit < local_54) {
      return 0;
    }
    _i = 0.0;
    for (local_58 = 0; local_58 < 0x18; local_58 = local_58 + 3) {
      dVar1 = dist_two_points_3d(points_x[local_54],points_y[local_54],points_z[local_54],
                                 child_cub[local_58],child_cub[local_58 + 1],child_cub[local_58 + 2]
                                );
      if (_i < dVar1) {
        _i = dVar1;
      }
    }
    if (_i < disk_raduis) break;
    local_54 = local_54 + 1;
  }
  return 1;
}

Assistant:

int covered(double *child_cub,double *points_x,double *points_y,double *points_z, double disk_raduis,int hit)
{
	double distance;
	double max_distance;
	for (int m = 0; m <= hit; m++)
	{
		max_distance=0.0;
		for (int i = 0; i < 24; i=i+3)
		{
			distance=dist_two_points_3d(points_x[m],points_y[m],points_z[m],child_cub[i],child_cub[i+1],child_cub[i+2]);
			if (distance>max_distance) max_distance=distance;
		}
		if (max_distance < disk_raduis) return(1);
	}
	return(0);
}